

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTests.cpp
# Opt level: O0

void __thiscall
agge::tests::PathGeneratorAdapterTests::EmptySourcePathAddsNothingToGenerator
          (PathGeneratorAdapterTests *this)

{
  passthrough_generator *in_RCX;
  allocator local_149;
  string local_148 [32];
  LocationInfo local_128;
  allocator local_f9;
  string local_f8 [32];
  LocationInfo local_d8;
  int local_b0 [2];
  undefined1 local_a8 [8];
  path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
  pg;
  real_t local_68;
  real_t y;
  real_t x;
  undefined1 local_58 [8];
  passthrough_generator g;
  path empty;
  PathGeneratorAdapterTests *this_local;
  
  tests::mocks::path::path((path *)&g.kx);
  anon_unknown_2::passthrough_generator::passthrough_generator
            ((passthrough_generator *)local_58,1.0,1.0);
  assist<agge::tests::mocks::path,agge::tests::(anonymous_namespace)::passthrough_generator>
            ((path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
              *)local_a8,(agge *)&g.kx,(path *)local_58,in_RCX);
  local_b0[1] = 0;
  local_b0[0] = path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
                ::vertex((path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
                          *)local_a8,&local_68,(real_t *)&pg.field_0x34);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,&local_f9);
  ut::LocationInfo::LocationInfo(&local_d8,(string *)local_f8,0x39);
  ut::are_equal<agge::path_commands,int>((path_commands *)(local_b0 + 1),local_b0,&local_d8);
  ut::LocationInfo::~LocationInfo(&local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_148,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,&local_149);
  ut::LocationInfo::LocationInfo(&local_128,(string *)local_148,0x3c);
  ut::
  is_empty<std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>
            ((vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
              *)local_58,&local_128);
  ut::LocationInfo::~LocationInfo(&local_128);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
  ::~path_generator_adapter
            ((path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
              *)local_a8);
  anon_unknown_2::passthrough_generator::~passthrough_generator((passthrough_generator *)local_58);
  tests::mocks::path::~path((path *)&g.kx);
  return;
}

Assistant:

test( EmptySourcePathAddsNothingToGenerator )
			{
				// INIT
				const mocks::path empty;
				passthrough_generator g(1.0f, 1.0f);
				real_t x, y;

				// INIT / ACT
				path_generator_adapter<mocks::path, passthrough_generator> pg = assist(empty, g);

				// ACT / ASSERT
				assert_equal(path_command_stop, (int)pg.vertex(&x, &y));

				// ASSERT
				assert_is_empty(g.points);
			}